

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_serial(uchar **p,uchar *end,mbedtls_x509_buf *serial)

{
  byte *pbVar1;
  int iVar2;
  int ret;
  mbedtls_x509_buf *serial_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    p_local._4_4_ = -0x22e0;
  }
  else if ((**p == 0x82) || (**p == '\x02')) {
    pbVar1 = *p;
    *p = pbVar1 + 1;
    serial->tag = (uint)*pbVar1;
    iVar2 = mbedtls_asn1_get_len(p,end,&serial->len);
    if (iVar2 == 0) {
      serial->p = *p;
      *p = *p + serial->len;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = iVar2 + -0x2280;
    }
  }
  else {
    p_local._4_4_ = -0x22e2;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_serial( unsigned char **p, const unsigned char *end,
                     mbedtls_x509_buf *serial )
{
    int ret;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_SERIAL +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( **p != ( MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_PRIMITIVE | 2 ) &&
        **p !=   MBEDTLS_ASN1_INTEGER )
        return( MBEDTLS_ERR_X509_INVALID_SERIAL +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    serial->tag = *(*p)++;

    if( ( ret = mbedtls_asn1_get_len( p, end, &serial->len ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_SERIAL + ret );

    serial->p = *p;
    *p += serial->len;

    return( 0 );
}